

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_stored_session_ticket
              (ptls_t *tls,ptls_key_exchange_algorithm_t **key_share,ptls_cipher_suite_t **cs,
              ptls_iovec_t *secret,uint32_t *obfuscated_ticket_age,ptls_iovec_t *ticket,
              uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  ulong uVar1;
  undefined8 *in_RCX;
  long *in_RDX;
  byte *pbVar2;
  long *in_RSI;
  long *in_RDI;
  int *in_R8;
  ptls_iovec_t pVar3;
  byte *in_stack_00000010;
  uint32_t *in_stack_00000018;
  ptls_cipher_suite_t **cand_1;
  ptls_key_exchange_algorithm_t **cand;
  uint32_t *in_stack_00000030;
  uint32_t *in_stack_00000038;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  ptls_iovec_t nonce;
  uint64_t now;
  uint64_t obtained_at;
  uint32_t age_add;
  uint32_t lifetime;
  uint16_t csid;
  uint16_t kxid;
  uint8_t *in_stack_ffffffffffffff08;
  uint8_t **in_stack_ffffffffffffff10;
  uint64_t *in_stack_ffffffffffffff18;
  long *local_d8;
  long *local_d0;
  uint8_t *local_c8;
  size_t local_c0;
  ulong local_a0;
  long local_98;
  ulong local_78;
  long local_70;
  int local_64;
  ulong local_48;
  int local_3c;
  short local_34;
  short local_32;
  
  local_64 = ptls_decode64(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff08);
  if (((local_64 == 0) &&
      (local_64 = ptls_decode16((uint16_t *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                in_stack_ffffffffffffff08), local_64 == 0)) &&
     (local_64 = ptls_decode16((uint16_t *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                               in_stack_ffffffffffffff08), local_64 == 0)) {
    local_70 = 3;
    if ((ulong)((long)in_stack_00000018 - (long)in_stack_00000010) < 3) {
      local_64 = 0x32;
    }
    else {
      local_78 = 0;
      do {
        pbVar2 = in_stack_00000010 + 1;
        local_78 = local_78 << 8 | (ulong)*in_stack_00000010;
        local_70 = local_70 + -1;
        in_stack_00000010 = pbVar2;
      } while (local_70 != 0);
      if ((ulong)((long)in_stack_00000018 - (long)pbVar2) < local_78) {
        local_64 = 0x32;
      }
      else {
        local_64 = decode_new_session_ticket
                             ((ptls_t *)end_2,in_stack_00000038,in_stack_00000030,
                              (ptls_iovec_t *)cand,(ptls_iovec_t *)cand_1,in_stack_00000018,
                              (uint8_t *)_block_size64_1,(uint8_t *)_block_size_1);
        if (local_64 == 0) {
          local_98 = 2;
          if ((ulong)((long)in_stack_00000018 - (long)(pbVar2 + local_78)) < 2) {
            local_64 = 0x32;
          }
          else {
            local_a0 = 0;
            in_stack_00000010 = pbVar2 + local_78;
            do {
              pbVar2 = in_stack_00000010 + 1;
              local_a0 = local_a0 << 8 | (ulong)*in_stack_00000010;
              local_98 = local_98 + -1;
              in_stack_00000010 = pbVar2;
            } while (local_98 != 0);
            if ((ulong)((long)in_stack_00000018 - (long)pbVar2) < local_a0) {
              local_64 = 0x32;
            }
            else {
              pVar3 = ptls_iovec_init(pbVar2,(long)(pbVar2 + local_a0) - (long)pbVar2);
              local_c8 = pVar3.base;
              *in_RCX = local_c8;
              local_c0 = pVar3.len;
              in_RCX[1] = local_c0;
              if ((uint32_t *)(pbVar2 + local_a0) == in_stack_00000018) {
                for (local_d0 = *(long **)(*in_RDI + 0x10);
                    (*local_d0 != 0 && (*(short *)*local_d0 != local_32)); local_d0 = local_d0 + 1)
                {
                }
                if (*local_d0 == 0) {
                  local_64 = 0x203;
                }
                else {
                  *in_RSI = *local_d0;
                  for (local_d8 = *(long **)(*in_RDI + 0x18);
                      (*local_d8 != 0 && (*(short *)*local_d8 != local_34)); local_d8 = local_d8 + 1
                      ) {
                  }
                  if (*local_d8 == 0) {
                    local_64 = 0x203;
                  }
                  else {
                    *in_RDX = *local_d8;
                    uVar1 = (*(code *)**(undefined8 **)(*in_RDI + 8))(*(undefined8 *)(*in_RDI + 8));
                    if ((uVar1 < local_48) || (0x240c83ff < uVar1 - local_48)) {
                      local_64 = 0x203;
                    }
                    else {
                      *in_R8 = ((int)uVar1 - (int)local_48) + local_3c;
                      local_64 = 0;
                    }
                  }
                }
              }
              else {
                local_64 = 0x32;
              }
            }
          }
        }
      }
    }
  }
  return local_64;
}

Assistant:

static int decode_stored_session_ticket(ptls_t *tls, ptls_key_exchange_algorithm_t **key_share, ptls_cipher_suite_t **cs,
                                        ptls_iovec_t *secret, uint32_t *obfuscated_ticket_age, ptls_iovec_t *ticket,
                                        uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t kxid, csid;
    uint32_t lifetime, age_add;
    uint64_t obtained_at, now;
    ptls_iovec_t nonce;
    int ret;

    /* decode */
    if ((ret = ptls_decode64(&obtained_at, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode16(&kxid, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode16(&csid, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 3, {
        if ((ret = decode_new_session_ticket(tls, &lifetime, &age_add, &nonce, ticket, max_early_data_size, src, end)) != 0)
            goto Exit;
        src = end;
    });
    ptls_decode_block(src, end, 2, {
        *secret = ptls_iovec_init(src, end - src);
        src = end;
    });

    { /* determine the key-exchange */
        ptls_key_exchange_algorithm_t **cand;
        for (cand = tls->ctx->key_exchanges; *cand != NULL; ++cand)
            if ((*cand)->id == kxid)
                break;
        if (*cand == NULL) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        *key_share = *cand;
    }

    { /* determine the cipher-suite */
        ptls_cipher_suite_t **cand;
        for (cand = tls->ctx->cipher_suites; *cand != NULL; ++cand)
            if ((*cand)->id == csid)
                break;
        if (*cand == NULL) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        *cs = *cand;
    }

    /* calculate obfuscated_ticket_age */
    now = tls->ctx->get_time->cb(tls->ctx->get_time);
    if (!(obtained_at <= now && now - obtained_at < 7 * 86400 * 1000)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    *obfuscated_ticket_age = (uint32_t)(now - obtained_at) + age_add;

    ret = 0;
Exit:
    return ret;
}